

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O3

unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> __thiscall
anon_unknown.dwarf_256f7::create_dic(anon_unknown_dwarf_256f7 *this,string *dic_type)

{
  int iVar1;
  __uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true> in_RAX;
  __uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true> _Var2;
  Dictionary *extraout_RAX;
  Dictionary *extraout_RAX_00;
  Dictionary *extraout_RAX_01;
  _Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_> extraout_RAX_02;
  DictionaryMLT<false,_false> *this_00;
  __uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> extraout_RAX_03;
  _Head_base<0UL,_ddd::Dictionary_*,_false> _Var3;
  
  iVar1 = std::__cxx11::string::compare((char *)dic_type);
  if (iVar1 == 0) {
    this_00 = (DictionaryMLT<false,_false> *)operator_new(0x18);
    ddd::DictionarySGL<false,_false>::DictionarySGL((DictionarySGL<false,_false> *)this_00);
    _Var3._M_head_impl = extraout_RAX;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)dic_type);
    if (iVar1 == 0) {
      this_00 = (DictionaryMLT<false,_false> *)operator_new(0x18);
      ddd::DictionarySGL<false,_true>::DictionarySGL((DictionarySGL<false,_true> *)this_00);
      _Var3._M_head_impl = extraout_RAX_00;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)dic_type);
      if (iVar1 == 0) {
        this_00 = (DictionaryMLT<false,_false> *)operator_new(0x18);
        ddd::DictionarySGL<true,_false>::DictionarySGL((DictionarySGL<true,_false> *)this_00);
        _Var3._M_head_impl = extraout_RAX_01;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)dic_type);
        if (iVar1 == 0) {
          this_00 = (DictionaryMLT<false,_false> *)operator_new(0x18);
          ddd::DictionarySGL<true,_true>::DictionarySGL((DictionarySGL<true,_true> *)this_00);
          _Var3._M_head_impl =
               (Dictionary *)
               extraout_RAX_02.super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)dic_type);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)dic_type);
            if (iVar1 == 0) {
              ddd::make_unique<ddd::DictionaryMLT<false,true>>();
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)dic_type);
              if (iVar1 == 0) {
                ddd::make_unique<ddd::DictionaryMLT<true,false>>();
              }
              else {
                _Var2.super___uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>.
                _M_t.
                super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>.
                super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl =
                     (__uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>)
                     std::__cxx11::string::compare((char *)dic_type);
                if ((int)_Var2.
                         super___uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>
                         .super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl != 0) {
                  *(undefined8 *)this = 0;
                  return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>
                          )(tuple<ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>)
                           _Var2.
                           super___uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>
                           .super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl;
                }
                ddd::make_unique<ddd::DictionaryMLT<true,true>>();
              }
            }
            *(__uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)this =
                 in_RAX.
                 super___uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>._M_t.
                 super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>.
                 super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl;
            return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>
                    )(tuple<ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>)
                     in_RAX.
                     super___uniq_ptr_impl<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>
                     .super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl;
          }
          this_00 = (DictionaryMLT<false,_false> *)operator_new(0x38);
          ddd::DictionaryMLT<false,_false>::DictionaryMLT(this_00);
          _Var3._M_head_impl =
               (Dictionary *)
               extraout_RAX_03._M_t.
               super__Tuple_impl<0UL,_ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>.
               super__Head_base<0UL,_ddd::Dictionary_*,_false>._M_head_impl;
        }
      }
    }
  }
  *(DictionaryMLT<false,_false> **)this = this_00;
  return (__uniq_ptr_data<ddd::Dictionary,_std::default_delete<ddd::Dictionary>,_true,_true>)
         (tuple<ddd::Dictionary_*,_std::default_delete<ddd::Dictionary>_>)_Var3._M_head_impl;
}

Assistant:

std::unique_ptr<Dictionary> create_dic(const std::string dic_type) {
  if (dic_type == "SGL") {
    return make_unique<DictionarySGL<false, false>>();
  } else if (dic_type == "SGL_NL") {
    return make_unique<DictionarySGL<false, true>>();
  } else if (dic_type == "SGL_BL") {
    return make_unique<DictionarySGL<true, false>>();
  } else if (dic_type == "SGL_NL_BL") {
    return make_unique<DictionarySGL<true, true>>();
  } else if (dic_type == "MLT") {
    return make_unique<DictionaryMLT<false, false>>();
  } else if (dic_type == "MLT_NL") {
    return make_unique<DictionaryMLT<false, true>>();
  } else if (dic_type == "MLT_BL") {
    return make_unique<DictionaryMLT<true, false>>();
  } else if (dic_type == "MLT_NL_BL") {
    return make_unique<DictionaryMLT<true, true>>();
  }
  return nullptr;
}